

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimAngular::Dim2dPoint(ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  double dVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  double dVar4;
  ON_2dPoint OVar5;
  ON_2dPoint local_98;
  ON_OBSOLETE_V5_DimAngular *local_88;
  double local_80;
  undefined1 local_78 [8];
  ON_2dVector v2_1;
  double dp1;
  ON_OBSOLETE_V5_DimAngular *local_50;
  double local_48;
  undefined1 local_40 [8];
  ON_2dVector v2;
  double dp0;
  int point_index_local;
  ON_OBSOLETE_V5_DimAngular *this_local;
  ON_2dPoint p2;
  
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if ((iVar2 < 4) || (point_index < 0)) {
    p2.x = -1.23432101234321e+308;
    this_local = (ON_OBSOLETE_V5_DimAngular *)0xffe5f8bd9e331dd2;
  }
  else {
    dp0._4_4_ = point_index;
    if ((point_index == 10000) &&
       (dp0._4_4_ = 0x2713, ((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0
       )) {
      dp0._4_4_ = 0;
    }
    if (dp0._4_4_ < 4) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,dp0._4_4_);
      this_local = (ON_OBSOLETE_V5_DimAngular *)pOVar3->x;
      p2.x = pOVar3->y;
    }
    else {
      switch(dp0._4_4_) {
      case 0x2711:
        this_local = (ON_OBSOLETE_V5_DimAngular *)this->m_radius;
        p2.x = 0.0;
        break;
      case 0x2712:
        dVar1 = this->m_radius;
        dVar4 = cos(this->m_angle);
        this_local = (ON_OBSOLETE_V5_DimAngular *)(dVar1 * dVar4);
        dVar1 = this->m_radius;
        dVar4 = sin(this->m_angle);
        p2.x = dVar1 * dVar4;
        break;
      case 0x2713:
        dVar1 = this->m_radius;
        dVar4 = cos(this->m_angle * 0.5);
        this_local = (ON_OBSOLETE_V5_DimAngular *)(dVar1 * dVar4);
        dVar1 = this->m_radius;
        dVar4 = sin(this->m_angle * 0.5);
        p2.x = dVar1 * dVar4;
        break;
      case 0x2714:
        this_local = (ON_OBSOLETE_V5_DimAngular *)0x0;
        p2.x = 0.0;
        break;
      case 0x2715:
        pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,1);
        this_local = (ON_OBSOLETE_V5_DimAngular *)pOVar3->x;
        p2.x = pOVar3->y;
        v2.y = DimpointOffset(this,0);
        if (0.0 <= v2.y) {
          ON_2dVector::ON_2dVector((ON_2dVector *)local_40,(ON_2dPoint *)&this_local);
          ON_2dVector::Unitize((ON_2dVector *)local_40);
          ON_2dPoint::ON_2dPoint((ON_2dPoint *)&dp1,(ON_2dVector *)local_40);
          OVar5 = ON_2dPoint::operator*((ON_2dPoint *)&dp1,v2.y);
          local_50 = (ON_OBSOLETE_V5_DimAngular *)OVar5.x;
          this_local = local_50;
          local_48 = OVar5.y;
          p2.x = local_48;
        }
        break;
      case 0x2716:
        pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,2);
        this_local = (ON_OBSOLETE_V5_DimAngular *)pOVar3->x;
        p2.x = pOVar3->y;
        v2_1.y = DimpointOffset(this,1);
        if (0.0 <= v2_1.y) {
          ON_2dVector::ON_2dVector((ON_2dVector *)local_78,(ON_2dPoint *)&this_local);
          ON_2dVector::Unitize((ON_2dVector *)local_78);
          ON_2dPoint::ON_2dPoint(&local_98,(ON_2dVector *)local_78);
          OVar5 = ON_2dPoint::operator*(&local_98,v2_1.y);
          local_88 = (ON_OBSOLETE_V5_DimAngular *)OVar5.x;
          this_local = local_88;
          local_80 = OVar5.y;
          p2.x = local_80;
        }
        break;
      default:
        p2.x = -1.23432101234321e+308;
        this_local = (ON_OBSOLETE_V5_DimAngular *)0xffe5f8bd9e331dd2;
      }
    }
  }
  OVar5.y = p2.x;
  OVar5.x = (double)this_local;
  return OVar5;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimAngular::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext 
                  ? userpositionedtext_pt_index
                  : arcmid_pt;
    }
    
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }
    else
    {
      switch(point_index)
      {
      case arcstart_pt:
        p2.x = m_radius;
        p2.y = 0.0;
        break;
      case arcend_pt:
        p2.x = m_radius*cos(m_angle);
        p2.y = m_radius*sin(m_angle);
        break;
      case arccenter_pt:
        p2.x = 0.0;
        p2.y = 0.0;
        break;
      case arcmid_pt:
        p2.x = m_radius*cos(0.5*m_angle);
        p2.y = m_radius*sin(0.5*m_angle);
        break;
      case extension0_pt:
        {
          p2 = m_points[start_pt_index];
          double dp0 = DimpointOffset(0);
          if(dp0 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp0;
          }
        }
        break;
      case extension1_pt:
        {
          p2 = m_points[end_pt_index];
          double dp1 = DimpointOffset(1);
          if(dp1 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp1;
          }
        }
        break;
      default:
        p2.x = p2.y = ON_UNSET_VALUE;
        break;
      }
    }
  }
  return p2;
}